

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

bool ZiSaveDatabase(hs_database_t *db,ZiEncryptHdr *header,char *file)

{
  char *pcVar1;
  uint uVar2;
  _Ios_Openmode _Var3;
  char local_240 [8];
  ofstream out;
  undefined8 uStack_38;
  hs_error_t err;
  size_t db_len;
  char *serialized_db;
  char *file_local;
  ZiEncryptHdr *header_local;
  hs_database_t *db_local;
  
  serialized_db = file;
  file_local = (char *)header;
  header_local = (ZiEncryptHdr *)db;
  printf("[ Info ] Serializing database to file: \'%s\'\n",file);
  db_len = 0;
  uStack_38 = 0;
  uVar2 = hs_serialize_database(header_local,&db_len,&stack0xffffffffffffffc8);
  if (uVar2 == 0) {
    printf("[ Info ] Serialized Size: \'%zu\'\n",uStack_38);
    pcVar1 = serialized_db;
    _Var3 = std::operator|(_S_bin,_S_out);
    std::ofstream::ofstream(local_240,pcVar1,_Var3);
    if (file_local == (char *)0x0) {
      printf("[ Info ] Serialize: DB will not be encrypted\n");
    }
    else {
      printf("[ Info ] Serialize: Writing header...\n");
      std::ostream::write(local_240,(long)file_local);
    }
    std::ostream::write(local_240,db_len);
    std::ofstream::close();
    free((void *)db_len);
    db_local._7_1_ = 1;
    std::ofstream::~ofstream(local_240);
  }
  else {
    fprintf(_stderr,"[ ERROR ] Serialize Failed with: \'%d\'\n",(ulong)uVar2);
    db_local._7_1_ = 0;
  }
  return (bool)(db_local._7_1_ & 1);
}

Assistant:

bool ZiSaveDatabase(const hs_database_t* db, struct ZiEncryptHdr* header,
    const char* file)
{
    printf("[ Info ] Serializing database to file: '%s'\n", file);

    char* serialized_db = nullptr;
    size_t db_len = 0;
    hs_error_t err = hs_serialize_database(db, &serialized_db, &db_len);
    if (err != HS_SUCCESS)
    {
        fprintf(stderr, "[ ERROR ] Serialize Failed with: '%d'\n", err);
        return false;
    }
    printf("[ Info ] Serialized Size: '%zu'\n", db_len);

    ofstream out(file, ios::binary | ios::out);
    if (header)
    {
        printf("[ Info ] Serialize: Writing header...\n");
        out.write((char*) header, sizeof(struct ZiEncryptHdr));
    }
    else
    {
        printf("[ Info ] Serialize: DB will not be encrypted\n");
    }

    out.write(serialized_db, db_len);
    out.close();

    free(serialized_db);
    return true;
}